

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

RootSymbol * __thiscall
slang::ast::Compilation::getRoot(Compilation *this,bool skipDefParamsAndBinds)

{
  byte *pbVar1;
  pointer *pppSVar2;
  flat_hash_set<std::string_view> *pfVar3;
  size_t *psVar4;
  group_type_pointer pgVar5;
  group_type_pointer pgVar6;
  group_type_pointer pgVar7;
  group_type_pointer pgVar8;
  char cVar9;
  undefined4 uVar10;
  pointer pbVar11;
  iterator __position;
  byte *pbVar12;
  RootSymbol *pRVar13;
  pointer ppSVar14;
  group_type_pointer pgVar15;
  value_type_pointer pbVar16;
  size_type sVar17;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __first;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __last;
  Symbol *pSVar18;
  DefinitionSymbol *pDVar19;
  SyntaxNode *pSVar20;
  value_type_pointer ppVar21;
  group_type_pointer pgVar22;
  value_type_pointer ppVar23;
  undefined8 *puVar24;
  ConfigBlockSymbol *this_00;
  size_t sVar25;
  pointer ppDVar26;
  pointer ppCVar27;
  pointer ppCVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ushort uVar34;
  DefinitionLookupResult result;
  value_type_pointer ppVar35;
  byte bVar36;
  int iVar37;
  Compilation *pCVar38;
  ParameterDecl *pPVar39;
  Compilation *pCVar40;
  ulong uVar41;
  flat_hash_map<OpaqueInstancePath::Entry,_HierarchyOverrideNode> *arrays_;
  uint64_t uVar42;
  HierarchyOverrideNode *pHVar43;
  InstanceSymbol *pIVar44;
  void *pvVar45;
  SourceLibrary *pSVar46;
  Diagnostic *pDVar47;
  SourceLibrary *pSVar48;
  undefined4 extraout_var;
  Compilation *in_RCX;
  size_type __len;
  Scope *pSVar49;
  slot_type sVar50;
  table_element_pointer extraout_RDX;
  less *extraout_RDX_00;
  table_element_pointer extraout_RDX_02;
  less *extraout_RDX_04;
  table_element_pointer extraout_RDX_06;
  table_element_pointer ppVar51;
  table_element_pointer extraout_RDX_08;
  ulong uVar52;
  table_element_pointer extraout_RDX_09;
  char *pcVar53;
  table_element_pointer extraout_RDX_10;
  table_element_pointer extraout_RDX_11;
  size_t extraout_RDX_12;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __lasti;
  pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode> *ppVar54;
  SyntaxNode *pSVar55;
  uint uVar56;
  size_type __rlen;
  ParameterDecl *pPVar57;
  char_pointer puVar58;
  pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange> *ppVar59;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  _Var60;
  SyntaxNode *pSVar61;
  identity iVar62;
  identity *piVar63;
  identity *piVar64;
  char_pointer puVar65;
  identity *in_R8;
  identity *piVar66;
  ulong uVar67;
  long lVar68;
  value_type *elements_1;
  ulong uVar69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *libName;
  pointer pbVar70;
  pointer ppSVar71;
  ulong uVar72;
  undefined8 *puVar73;
  pointer pTVar74;
  pointer ppVar75;
  value_type_pointer __u;
  pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange> *__i;
  table_element_pointer ppVar76;
  pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange> *ppVar77;
  string_view *psVar78;
  table_element_pointer pbVar79;
  pointer ppDVar80;
  size_type __n;
  long lVar81;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __last_00;
  undefined1 *puVar82;
  pointer pTVar83;
  bool bVar84;
  uchar uVar85;
  uchar uVar99;
  uchar uVar100;
  byte bVar101;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  byte bVar108;
  uchar uVar110;
  uchar uVar111;
  uchar uVar112;
  uchar uVar113;
  uchar uVar114;
  uchar uVar115;
  byte bVar116;
  uchar uVar117;
  uchar uVar118;
  uchar uVar119;
  undefined1 auVar102 [16];
  byte bVar120;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  identity iVar109;
  undefined1 auVar107 [16];
  iterator iVar121;
  iterator iVar122;
  iterator iVar123;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_02;
  string_view sVar124;
  _Val_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_03;
  _Val_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_04;
  string_view arg;
  string_view arg_00;
  string_view name;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_05;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_06;
  size_t pos;
  value_type *elements;
  anon_class_24_3_d9e6786c tryAddTop;
  flat_hash_map<std::string_view,_const_ConstantValue_*> cliOverrides;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>,_const_slang::syntax::DeclaratorSyntax_*const_&,_void>
  x;
  SmallVector<const_slang::ast::InstanceSymbol_*,_5UL> topList;
  SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
  topDefs;
  char_pointer local_310;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  undefined1 local_2b8 [16];
  identity *local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  Compilation *local_278;
  size_t local_270;
  flat_hash_map<std::string_view,_const_ConstantValue_*> local_268;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_238;
  size_t local_220;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_218;
  DefinitionSymbol *local_210;
  ConfigBlockSymbol *pCStack_208;
  ConfigRule *local_200;
  undefined1 local_1f8 [24];
  SourceRange local_1e0;
  Symbol *local_1d0;
  InstanceSymbol *local_198;
  InstanceSymbol *local_190;
  __extent_storage<18446744073709551615UL> local_188;
  InstanceBodySymbol *local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  Symbol *local_158;
  undefined1 auStack_150 [16];
  SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
  local_140;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  byte bStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  byte bStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  byte bStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  uchar local_c8;
  uchar uStack_c7;
  uchar uStack_c6;
  byte bStack_c5;
  uchar uStack_c4;
  uchar uStack_c3;
  uchar uStack_c2;
  byte bStack_c1;
  uchar uStack_c0;
  uchar uStack_bf;
  uchar uStack_be;
  byte bStack_bd;
  uchar uStack_bc;
  uchar uStack_bb;
  uchar uStack_ba;
  byte bStack_b9;
  uchar local_b8;
  uchar uStack_b7;
  uchar uStack_b6;
  byte bStack_b5;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  byte bStack_b1;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  byte bStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  byte bStack_a9;
  uchar local_a8;
  uchar uStack_a7;
  uchar uStack_a6;
  uchar uStack_a5;
  uchar uStack_a4;
  uchar uStack_a3;
  uchar uStack_a2;
  uchar uStack_a1;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  uchar uStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  identity iStack_99;
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  uchar uStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  uchar uStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  uchar uStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  identity iStack_89;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  byte bStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  byte bStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  identity iStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  identity iStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  table_element_pointer extraout_RDX_01;
  table_element_pointer extraout_RDX_03;
  table_element_pointer extraout_RDX_05;
  table_element_pointer extraout_RDX_07;
  
  if (this->finalized == true) {
    return (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  }
  std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>::reserve
            (&this->defaultLiblist,
             (long)(this->options).defaultLiblist.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->options).defaultLiblist.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar70 = (this->options).defaultLiblist.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (this->options).defaultLiblist.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar70 != pbVar11) {
    do {
      sVar124._M_str = (pbVar70->_M_dataplus)._M_p;
      sVar124._M_len = pbVar70->_M_string_length;
      local_1f8._0_8_ = getSourceLibrary(this,sVar124);
      if ((DefinitionSymbol *)local_1f8._0_8_ != (DefinitionSymbol *)0x0) {
        __position._M_current =
             (this->defaultLiblist).
             super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        in_RCX = this;
        if (__position._M_current ==
            (this->defaultLiblist).
            super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<slang::SourceLibrary_const*,std::allocator<slang::SourceLibrary_const*>>::
          _M_realloc_insert<slang::SourceLibrary_const*const&>
                    ((vector<slang::SourceLibrary_const*,std::allocator<slang::SourceLibrary_const*>>
                      *)&this->defaultLiblist,__position,(SourceLibrary **)local_1f8);
        }
        else {
          *__position._M_current = (SourceLibrary *)local_1f8._0_8_;
          pppSVar2 = &(this->defaultLiblist).
                      super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppSVar2 = *pppSVar2 + 1;
        }
      }
      pbVar70 = pbVar70 + 1;
    } while (pbVar70 != pbVar11);
  }
  local_268.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
  .arrays.groups_size_index = 0x3f;
  local_268.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
  .arrays.groups_size_mask = 1;
  local_268.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_268.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_268.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
  .size_ctrl.ml = 0;
  local_268.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
  .size_ctrl.size = 0;
  parseParamOverrides(this,&local_268);
  if (!skipDefParamsAndBinds) {
    in_RCX = (Compilation *)
             (this->syntaxTrees).
             super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar38 = (Compilation *)
                   (this->syntaxTrees).
                   super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar38 != in_RCX;
        pCVar38 = (Compilation *)&pCVar38->options) {
      pbVar12 = (pCVar38->super_BumpAllocator).head[0x15].current;
      if ((pbVar12[0xd0] != 0) || (pbVar12[0xd1] == 1)) {
        resolveDefParamsAndBinds(this);
        break;
      }
    }
  }
  this->finalizing = true;
  local_140.
  super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
  .data_ = (pointer)local_140.
                    super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                    .firstElement;
  local_140.
  super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
  .len = 0;
  local_140.
  super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
  .cap = 2;
  if ((this->options).topModules.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .size_ctrl.size == 0) {
    iVar121 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
              ::begin(&(this->definitionMap).table_);
    ppVar51 = iVar121.p_;
    if (ppVar51 != (table_element_pointer)0x0) {
      pfVar3 = &this->globalInstantiations;
LAB_0035a4ba:
      do {
        ppVar51 = iVar121.p_;
        pRVar13 = (this->root)._M_t.
                  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                  .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        pSVar49 = &pRVar13->super_Scope;
        if (pRVar13 == (RootSymbol *)0x0) {
          pSVar49 = (Scope *)0x0;
        }
        if ((ppVar51->first).
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
            super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl == pSVar49) {
          ppSVar14 = (ppVar51->second).first.
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppSVar71 = (ppVar51->second).first.
                          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppSVar71 != ppSVar14;
              ppSVar71 = ppSVar71 + 1) {
            pDVar19 = (DefinitionSymbol *)*ppSVar71;
            if ((*(int *)&((_Alloc_hider *)&(pDVar19->super_Symbol).kind)->_M_p == 2) &&
               (pDVar19->sourceLibrary->isDefault == true)) {
              psVar78 = &(pDVar19->super_Symbol).name;
              uVar42 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)pfVar3,psVar78);
              uVar41 = uVar42 >> ((byte)(pfVar3->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                        .arrays.groups_size_index & 0x3f);
              uVar10 = (&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word)[uVar42 & 0xff];
              in_R8 = (identity *)0x0;
              do {
                pgVar15 = (this->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_;
                pgVar5 = pgVar15 + uVar41;
                local_88 = pgVar5->m[0].n;
                uStack_87 = pgVar5->m[1].n;
                uStack_86 = pgVar5->m[2].n;
                bStack_85 = pgVar5->m[3].n;
                uStack_84 = pgVar5->m[4].n;
                uStack_83 = pgVar5->m[5].n;
                uStack_82 = pgVar5->m[6].n;
                bStack_81 = pgVar5->m[7].n;
                uStack_80 = pgVar5->m[8].n;
                uStack_7f = pgVar5->m[9].n;
                uStack_7e = pgVar5->m[10].n;
                bStack_7d = pgVar5->m[0xb].n;
                uStack_7c = pgVar5->m[0xc].n;
                uStack_7b = pgVar5->m[0xd].n;
                uStack_7a = pgVar5->m[0xe].n;
                bVar101 = pgVar5->m[0xf].n;
                uVar85 = (uchar)uVar10;
                auVar86[0] = -(local_88 == uVar85);
                uVar99 = (uchar)((uint)uVar10 >> 8);
                auVar86[1] = -(uStack_87 == uVar99);
                uVar100 = (uchar)((uint)uVar10 >> 0x10);
                auVar86[2] = -(uStack_86 == uVar100);
                bVar108 = (byte)((uint)uVar10 >> 0x18);
                auVar86[3] = -(bStack_85 == bVar108);
                auVar86[4] = -(uStack_84 == uVar85);
                auVar86[5] = -(uStack_83 == uVar99);
                auVar86[6] = -(uStack_82 == uVar100);
                auVar86[7] = -(bStack_81 == bVar108);
                auVar86[8] = -(uStack_80 == uVar85);
                auVar86[9] = -(uStack_7f == uVar99);
                auVar86[10] = -(uStack_7e == uVar100);
                auVar86[0xb] = -(bStack_7d == bVar108);
                auVar86[0xc] = -(uStack_7c == uVar85);
                auVar86[0xd] = -(uStack_7b == uVar99);
                auVar86[0xe] = -(uStack_7a == uVar100);
                auVar86[0xf] = -(bVar101 == bVar108);
                uVar56 = (uint)(ushort)((ushort)(SUB161(auVar86 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar86 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar86 >> 0x77,0) & 1) << 0xe);
                bStack_79 = bVar101;
                if (uVar56 != 0) {
                  local_2b8._0_8_ = in_R8;
                  pbVar16 = (this->globalInstantiations).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.elements_;
                  local_298._0_8_ = uVar41;
                  do {
                    in_R8 = (identity *)(ulong)uVar56;
                    iVar37 = 0;
                    if (uVar56 != 0) {
                      for (; (uVar56 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
                      }
                    }
                    bVar84 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                             operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)pfVar3,psVar78,
                                        (basic_string_view<char,_std::char_traits<char>_> *)
                                        ((long)&pbVar16[uVar41 * 0xf]._M_len +
                                        (ulong)(uint)(iVar37 << 4)));
                    if (bVar84) goto LAB_0035a539;
                    uVar56 = uVar56 - 1 & uVar56;
                  } while (uVar56 != 0);
                  bVar101 = pgVar15[uVar41].m[0xf].n;
                  uVar41 = local_298._0_8_;
                  in_R8 = (identity *)local_2b8._0_8_;
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar42 & 7] & bVar101) == 0)
                break;
                piVar66 = (identity *)
                          (this->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_size_mask;
                piVar63 = in_R8 + uVar41 + 1;
                in_R8 = in_R8 + 1;
                uVar41 = (ulong)piVar63 & (ulong)piVar66;
              } while (in_R8 <= piVar66);
              if (((pDVar19->syntaxTree == (SyntaxTree *)0x0) ||
                  (pDVar19->syntaxTree->isLibraryUnit == false)) &&
                 ((pDVar19->definitionKind & ~Program) == Module)) {
                sVar17 = (pDVar19->parameters).
                         super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len;
                if (sVar17 != 0) {
                  pPVar57 = (pDVar19->parameters).
                            super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_
                  ;
                  pPVar39 = pPVar57 + sVar17;
                  do {
                    bVar84 = DefinitionSymbol::ParameterDecl::hasDefault(pPVar57);
                    if (!bVar84) {
                      if (pPVar57->isTypeParam == false) {
                        uVar42 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                                 operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                             *)&local_268,&pPVar57->name);
                        uVar52 = uVar42 >> ((byte)local_268.table_.
                                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                                  .arrays.groups_size_index._0_1_ & 0x3f);
                        uVar10 = (&boost::unordered::detail::foa::
                                   group15<boost::unordered::detail::foa::plain_integral>::
                                   match_word(unsigned_long)::word)[uVar42 & 0xff];
                        auVar102._4_4_ = uVar10;
                        auVar102._0_4_ = uVar10;
                        auVar102._8_4_ = uVar10;
                        auVar102._12_4_ = uVar10;
                        uVar41 = (ulong)((uint)uVar42 & 7);
                        uVar67 = 0;
                        do {
                          ppVar35 = local_268.table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                    .arrays.elements_;
                          piVar66 = (identity *)
                                    ((long)local_268.table_.
                                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                           .arrays.groups_ + uVar52 * 0x10);
                          local_98 = *(uchar *)piVar66;
                          uStack_97 = *(uchar *)(piVar66 + 1);
                          uStack_96 = *(uchar *)(piVar66 + 2);
                          uStack_95 = *(uchar *)(piVar66 + 3);
                          uStack_94 = *(uchar *)(piVar66 + 4);
                          uStack_93 = *(uchar *)(piVar66 + 5);
                          uStack_92 = *(uchar *)(piVar66 + 6);
                          uStack_91 = *(uchar *)(piVar66 + 7);
                          uStack_90 = *(uchar *)(piVar66 + 8);
                          uStack_8f = *(uchar *)(piVar66 + 9);
                          uStack_8e = *(uchar *)(piVar66 + 10);
                          uStack_8d = *(uchar *)(piVar66 + 0xb);
                          uStack_8c = *(uchar *)(piVar66 + 0xc);
                          uStack_8b = *(uchar *)(piVar66 + 0xd);
                          uStack_8a = *(uchar *)(piVar66 + 0xe);
                          sVar50.n = *(uchar *)(piVar66 + 0xf);
                          auVar87[0] = -(local_98 == auVar102[0]);
                          auVar87[1] = -(uStack_97 == auVar102[1]);
                          auVar87[2] = -(uStack_96 == auVar102[2]);
                          auVar87[3] = -(uStack_95 == auVar102[3]);
                          auVar87[4] = -(uStack_94 == auVar102[4]);
                          auVar87[5] = -(uStack_93 == auVar102[5]);
                          auVar87[6] = -(uStack_92 == auVar102[6]);
                          auVar87[7] = -(uStack_91 == auVar102[7]);
                          auVar87[8] = -(uStack_90 == auVar102[8]);
                          auVar87[9] = -(uStack_8f == auVar102[9]);
                          auVar87[10] = -(uStack_8e == auVar102[10]);
                          auVar87[0xb] = -(uStack_8d == auVar102[0xb]);
                          auVar87[0xc] = -(uStack_8c == auVar102[0xc]);
                          auVar87[0xd] = -(uStack_8b == auVar102[0xd]);
                          auVar87[0xe] = -(uStack_8a == auVar102[0xe]);
                          auVar87[0xf] = -((identity)sVar50.n == auVar102[0xf]);
                          uVar56 = (uint)(ushort)((ushort)(SUB161(auVar87 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar87 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar87 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar87 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar87 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar87 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar87 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar87 >> 0x6f,0) & 1) << 0xd |
                                                 (ushort)(SUB161(auVar87 >> 0x77,0) & 1) << 0xe);
                          in_R8 = (identity *)
                                  local_268.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                  .arrays.groups_;
                          iStack_89 = (identity)sVar50.n;
                          if (uVar56 != 0) {
                            local_298._0_8_ = uVar41;
                            in_R8 = (identity *)
                                    ((long)local_268.table_.
                                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                           .arrays.groups_ + uVar52 * 0x10);
                            local_2b8 = auVar102;
                            local_2a0 = in_R8;
                            do {
                              uVar29 = 0;
                              if (uVar56 != 0) {
                                for (; (uVar56 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                                }
                              }
                              bVar84 = std::
                                       equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       ::operator()((
                                                  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                                  *)&local_268,&pPVar57->name,
                                                  &ppVar35[uVar52 * 0xf + (ulong)uVar29].first);
                              if (bVar84) goto LAB_0035a6d8;
                              uVar56 = uVar56 - 1 & uVar56;
                            } while (uVar56 != 0);
                            sVar50.n = *(uchar *)(local_2a0 + 0xf);
                            uVar41 = local_298._0_8_;
                            auVar102 = local_2b8;
                          }
                          if (((&boost::unordered::detail::foa::
                                 group15<boost::unordered::detail::foa::plain_integral>::
                                 is_not_overflowed(unsigned_long)::shift)[uVar41] & sVar50.n) == 0)
                          break;
                          lVar68 = uVar52 + uVar67;
                          uVar67 = uVar67 + 1;
                          uVar52 = lVar68 + 1U &
                                   local_268.table_.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                   .arrays.groups_size_mask;
                        } while (uVar67 <= local_268.table_.
                                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                           .arrays.groups_size_mask);
                      }
                      goto LAB_0035a842;
                    }
LAB_0035a6d8:
                    pPVar57 = pPVar57 + 1;
                  } while (pPVar57 != pPVar39);
                }
                local_1f8._8_8_ = 0;
                local_1f8._16_8_ = (char *)0x0;
                local_1e0.startLoc = (SourceLocation)0x0;
                local_1e0.endLoc = (SourceLocation)0x0;
                local_1f8._0_8_ = pDVar19;
                SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>>
                ::
                emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>>
                          ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>>
                            *)&local_140,
                           (pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>
                            *)local_1f8);
              }
              else {
LAB_0035a842:
                local_1f8._0_8_ = pDVar19;
                std::
                vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                ::emplace_back<slang::ast::DefinitionSymbol_const*>
                          ((vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                            *)&this->unreferencedDefs,(DefinitionSymbol **)local_1f8);
              }
            }
LAB_0035a539:
          }
        }
        in_RCX = (Compilation *)(iVar121.pc_ + 0x12);
        pCVar38 = (Compilation *)(iVar121.pc_ + 2);
LAB_0035a4e1:
        pCVar40 = pCVar38;
        puVar58 = iVar121.pc_;
        ppVar76 = iVar121.p_ + 1;
        if (((uint)iVar121.pc_ & 0xf) != 0xe) goto code_r0x0035a4f4;
        auVar88[0] = -(*(char *)&(pCVar40->super_BumpAllocator).head == '\0');
        auVar88[1] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 1) == '\0');
        auVar88[2] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 2) == '\0');
        auVar88[3] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 3) == '\0');
        auVar88[4] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 4) == '\0');
        auVar88[5] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 5) == '\0');
        auVar88[6] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 6) == '\0');
        auVar88[7] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 7) == '\0');
        auVar88[8] = -(*(char *)&(pCVar40->super_BumpAllocator).endPtr == '\0');
        auVar88[9] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 1) == '\0');
        auVar88[10] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 2) == '\0');
        auVar88[0xb] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 3) == '\0');
        auVar88[0xc] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 4) == '\0');
        auVar88[0xd] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 5) == '\0');
        auVar88[0xe] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 6) == '\0');
        auVar88[0xf] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 7) == '\0');
        uVar34 = (ushort)(SUB161(auVar88 >> 7,0) & 1) | (ushort)(SUB161(auVar88 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe;
        while (uVar56 = (uint)uVar34, uVar56 == 0x7fff) {
          ppVar76 = ppVar76 + 0xf;
          auVar89[0] = -(*(char *)&(in_RCX->super_BumpAllocator).head == '\0');
          auVar89[1] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 1) == '\0');
          auVar89[2] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 2) == '\0');
          auVar89[3] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 3) == '\0');
          auVar89[4] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 4) == '\0');
          auVar89[5] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 5) == '\0');
          auVar89[6] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 6) == '\0');
          auVar89[7] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 7) == '\0');
          auVar89[8] = -(*(char *)&(in_RCX->super_BumpAllocator).endPtr == '\0');
          auVar89[9] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 1) == '\0');
          auVar89[10] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 2) == '\0');
          auVar89[0xb] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 3) == '\0');
          auVar89[0xc] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 4) == '\0');
          auVar89[0xd] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 5) == '\0');
          auVar89[0xe] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 6) == '\0');
          auVar89[0xf] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 7) == '\0');
          pCVar40 = in_RCX;
          in_RCX = (Compilation *)&in_RCX->options;
          uVar34 = (ushort)(SUB161(auVar89 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe;
        }
        ppVar51 = (table_element_pointer)(ulong)uVar56;
        uVar29 = 0;
        if ((uVar56 ^ 0x7fff) != 0) {
          for (; ((uVar56 ^ 0x7fff) >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        in_RCX = (Compilation *)(ulong)uVar29;
        if (*(char *)((long)&(pCVar40->super_BumpAllocator).head +
                     (long)&(in_RCX->super_BumpAllocator).head) == '\x01') break;
        iVar121.p_ = ppVar76 + (long)in_RCX;
        iVar121.pc_ = (char_pointer)
                      ((long)&(pCVar40->super_BumpAllocator).head +
                      (long)&(in_RCX->super_BumpAllocator).head);
      } while( true );
    }
  }
  else {
    local_288._0_8_ = local_1f8;
    local_188._M_extent_value = 0x3f;
    local_180 = (InstanceBodySymbol *)0x1;
    local_178 = ZEXT816(0x509420);
    local_168 = (undefined1  [16])0x0;
    local_288._8_8_ = &local_140;
    local_278 = this;
    local_198 = (InstanceSymbol *)local_288._0_8_;
    local_190 = (InstanceSymbol *)local_288._0_8_;
    iVar122 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::begin(&(this->options).topModules.table_);
    if (iVar122.p_ != (table_element_pointer)0x0) {
      local_218 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  &this->configBlocks;
LAB_0035b41c:
      psVar78 = iVar122.p_;
      pSVar20 = (SyntaxNode *)psVar78->_M_len;
      pcVar53 = psVar78->_M_str;
      sVar124 = *psVar78;
      local_298._0_8_ = pcVar53;
      local_2c8._M_len = (size_t)pSVar20;
      local_2c8._M_str = pcVar53;
      if (pSVar20 == (SyntaxNode *)0x0) {
        pSVar48 = (SourceLibrary *)0x0;
LAB_0035b4b7:
        pRVar13 = (this->root)._M_t.
                  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                  .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        local_238.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len = local_2c8._M_len;
        local_238.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str = local_2c8._M_str;
        local_238.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
        super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
             (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)&pRVar13->super_Scope;
        if (pRVar13 == (RootSymbol *)0x0) {
          local_238.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
          super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
               (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)(Scope *)0x0;
        }
        local_270 = 0;
        slang::detail::hashing::
        HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
        ::apply(&local_270,&local_238);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_270;
        uVar52 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar33,8) ^
                 SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar33,0);
        uVar67 = uVar52 >> ((byte)(this->definitionMap).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                                  .arrays.groups_size_index & 0x3f);
        uVar10 = (&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word)[uVar52 & 0xff];
        uVar41 = 0;
        do {
          pgVar22 = (this->definitionMap).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                    .arrays.groups_;
          pgVar8 = pgVar22 + uVar67;
          local_48 = pgVar8->m[0].n;
          uStack_47 = pgVar8->m[1].n;
          uStack_46 = pgVar8->m[2].n;
          bStack_45 = pgVar8->m[3].n;
          uStack_44 = pgVar8->m[4].n;
          uStack_43 = pgVar8->m[5].n;
          uStack_42 = pgVar8->m[6].n;
          bStack_41 = pgVar8->m[7].n;
          uStack_40 = pgVar8->m[8].n;
          uStack_3f = pgVar8->m[9].n;
          uStack_3e = pgVar8->m[10].n;
          bStack_3d = pgVar8->m[0xb].n;
          uStack_3c = pgVar8->m[0xc].n;
          uStack_3b = pgVar8->m[0xd].n;
          uStack_3a = pgVar8->m[0xe].n;
          bVar101 = pgVar8->m[0xf].n;
          uVar85 = (uchar)uVar10;
          auVar94[0] = -(local_48 == uVar85);
          uVar99 = (uchar)((uint)uVar10 >> 8);
          auVar94[1] = -(uStack_47 == uVar99);
          uVar100 = (uchar)((uint)uVar10 >> 0x10);
          auVar94[2] = -(uStack_46 == uVar100);
          bVar108 = (byte)((uint)uVar10 >> 0x18);
          auVar94[3] = -(bStack_45 == bVar108);
          auVar94[4] = -(uStack_44 == uVar85);
          auVar94[5] = -(uStack_43 == uVar99);
          auVar94[6] = -(uStack_42 == uVar100);
          auVar94[7] = -(bStack_41 == bVar108);
          auVar94[8] = -(uStack_40 == uVar85);
          auVar94[9] = -(uStack_3f == uVar99);
          auVar94[10] = -(uStack_3e == uVar100);
          auVar94[0xb] = -(bStack_3d == bVar108);
          auVar94[0xc] = -(uStack_3c == uVar85);
          auVar94[0xd] = -(uStack_3b == uVar99);
          auVar94[0xe] = -(uStack_3a == uVar100);
          auVar94[0xf] = -(bVar101 == bVar108);
          uVar56 = (uint)(ushort)((ushort)(SUB161(auVar94 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar94 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar94 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar94 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar94 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar94 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar94 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar94 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar94 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar94 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar94 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar94 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar94 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar94 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar94 >> 0x77,0) & 1) << 0xe);
          bStack_39 = bVar101;
          if (uVar56 != 0) {
            ppVar23 = (this->definitionMap).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                      .arrays.elements_;
            do {
              uVar29 = 0;
              if (uVar56 != 0) {
                for (; (uVar56 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              __u = ppVar23 + uVar67 * 0xf + (ulong)uVar29;
              bVar84 = std::
                       __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                       ::__eq(&local_238,&__u->first);
              if (bVar84) {
                ppSVar71 = (__u->second).first.
                           super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                goto joined_r0x0035b62d;
              }
              uVar56 = uVar56 - 1 & uVar56;
            } while (uVar56 != 0);
            bVar101 = pgVar22[uVar67].m[0xf].n;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar52 & 7] & bVar101) == 0) break;
          uVar72 = (this->definitionMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                   .arrays.groups_size_mask;
          lVar68 = uVar67 + uVar41;
          uVar41 = uVar41 + 1;
          uVar67 = lVar68 + 1U & uVar72;
        } while (uVar41 <= uVar72);
LAB_0035b666:
        uVar42 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           (local_218,&local_2c8);
        pcVar53 = local_2c8._M_str;
        sVar25 = local_2c8._M_len;
        uVar41 = uVar42 >> ((byte)(this->configBlocks).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                                  .arrays.groups_size_index & 0x3f);
        local_2a0 = (identity *)
                    (this->configBlocks).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                    .arrays.groups_;
        uVar10 = (&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word)[uVar42 & 0xff];
        local_2b8._0_8_ =
             (this->configBlocks).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
             .arrays.elements_;
        local_220 = (this->configBlocks).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                    .arrays.groups_size_mask;
        uVar52 = 0;
        do {
          piVar66 = local_2a0 + uVar41 * 0x10;
          local_68 = *(uchar *)piVar66;
          uStack_67 = *(uchar *)(piVar66 + 1);
          uStack_66 = *(uchar *)(piVar66 + 2);
          bStack_65 = *(byte *)(piVar66 + 3);
          uStack_64 = *(uchar *)(piVar66 + 4);
          uStack_63 = *(uchar *)(piVar66 + 5);
          uStack_62 = *(uchar *)(piVar66 + 6);
          bStack_61 = *(byte *)(piVar66 + 7);
          uStack_60 = *(uchar *)(piVar66 + 8);
          uStack_5f = *(uchar *)(piVar66 + 9);
          uStack_5e = *(uchar *)(piVar66 + 10);
          bStack_5d = *(byte *)(piVar66 + 0xb);
          uStack_5c = *(uchar *)(piVar66 + 0xc);
          uStack_5b = *(uchar *)(piVar66 + 0xd);
          uStack_5a = *(uchar *)(piVar66 + 0xe);
          iVar62 = piVar66[0xf];
          uVar85 = (uchar)uVar10;
          auVar95[0] = -(local_68 == uVar85);
          uVar99 = (uchar)((uint)uVar10 >> 8);
          auVar95[1] = -(uStack_67 == uVar99);
          uVar100 = (uchar)((uint)uVar10 >> 0x10);
          auVar95[2] = -(uStack_66 == uVar100);
          iVar109 = SUB41((uint)uVar10 >> 0x18,0);
          auVar95[3] = -((identity)bStack_65 == iVar109);
          auVar95[4] = -(uStack_64 == uVar85);
          auVar95[5] = -(uStack_63 == uVar99);
          auVar95[6] = -(uStack_62 == uVar100);
          auVar95[7] = -((identity)bStack_61 == iVar109);
          auVar95[8] = -(uStack_60 == uVar85);
          auVar95[9] = -(uStack_5f == uVar99);
          auVar95[10] = -(uStack_5e == uVar100);
          auVar95[0xb] = -((identity)bStack_5d == iVar109);
          auVar95[0xc] = -(uStack_5c == uVar85);
          auVar95[0xd] = -(uStack_5b == uVar99);
          auVar95[0xe] = -(uStack_5a == uVar100);
          auVar95[0xf] = -(iVar62 == iVar109);
          uVar56 = (uint)(ushort)((ushort)(SUB161(auVar95 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar95 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar95 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar95 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar95 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar95 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar95 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar95 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar95 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar95 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar95 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar95 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar95 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar95 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar95 >> 0x77,0) & 1) << 0xe);
          iStack_59 = iVar62;
          if (uVar56 != 0) {
            lVar68 = local_2b8._0_8_ + uVar41 * 600;
            do {
              uVar29 = 0;
              if (uVar56 != 0) {
                for (; (uVar56 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar67 = (ulong)uVar29;
              if (((SyntaxNode *)sVar25 == *(SyntaxNode **)(lVar68 + uVar67 * 0x28)) &&
                 (((SyntaxNode *)sVar25 == (SyntaxNode *)0x0 ||
                  (iVar37 = bcmp(pcVar53,*(void **)(lVar68 + 8 + uVar67 * 0x28),sVar25), iVar37 == 0
                  )))) {
                lVar68 = lVar68 + uVar67 * 0x28;
                puVar73 = *(undefined8 **)(lVar68 + 0x10);
                puVar24 = *(undefined8 **)(lVar68 + 0x18);
                goto joined_r0x0035b9a1;
              }
              uVar56 = uVar56 - 1 & uVar56;
            } while (uVar56 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar42 & 7] & (byte)iVar62) == 0)
          break;
          lVar68 = uVar41 + uVar52;
          uVar52 = uVar52 + 1;
          uVar41 = lVar68 + 1U & local_220;
        } while (uVar52 <= local_220);
LAB_0035b9d0:
        pDVar47 = Scope::addDiag(&((this->root)._M_t.
                                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                  _M_head_impl)->super_Scope,(DiagCode)0x10000d,
                                 (SourceLocation)0xffffffffffffffff);
        arg_00._M_str = (char *)local_298._0_8_;
        arg_00._M_len = (size_t)pSVar20;
        Diagnostic::operator<<(pDVar47,arg_00);
      }
      else {
        pvVar45 = memchr(pcVar53,0x2e,(size_t)pSVar20);
        pSVar55 = (SyntaxNode *)((long)pvVar45 - (long)pcVar53);
        if (pSVar55 == (SyntaxNode *)0xffffffffffffffff || pvVar45 == (void *)0x0) {
          pSVar48 = (SourceLibrary *)0x0;
          pSVar55 = pSVar20;
LAB_0035b483:
          if ((pSVar55 < (SyntaxNode *)0x7) ||
             (*(int *)(pcVar53 + (long)((long)&pSVar55[-1].previewNode + 4)) != 0x6769666e ||
              *(int *)(pcVar53 + (long)((long)&pSVar55[-1].previewNode + 1)) != 0x6e6f633a))
          goto LAB_0035b4b7;
          local_2c8._M_len = (long)&pSVar55[-1].previewNode + 1;
          goto LAB_0035b666;
        }
        pSVar61 = pSVar55;
        if (pSVar20 < pSVar55) {
          pSVar61 = pSVar20;
        }
        name._M_str = pcVar53;
        name._M_len = (size_t)pSVar61;
        pSVar48 = getSourceLibrary(this,name);
        if (pSVar48 != (SourceLibrary *)0x0) {
          pbVar1 = (byte *)((long)&pSVar55->kind + 1);
          if (local_2c8._M_len <= pSVar55) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr");
          }
          pSVar55 = (SyntaxNode *)(local_2c8._M_len - (long)pbVar1);
          pcVar53 = local_2c8._M_str + (long)pbVar1;
          local_2c8._M_len = (size_t)pSVar55;
          local_2c8._M_str = pcVar53;
          goto LAB_0035b483;
        }
        pDVar47 = Scope::addDiag(&((this->root)._M_t.
                                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                  _M_head_impl)->super_Scope,(DiagCode)0x10000d,
                                 (SourceLocation)0xffffffffffffffff);
        Diagnostic::operator<<(pDVar47,sVar124);
      }
      goto LAB_0035bb76;
    }
LAB_0035a96c:
    iVar123 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
              ::begin(&(this->definitionMap).table_);
    ppVar51 = iVar123.p_;
    if (ppVar51 != (table_element_pointer)0x0) {
      pfVar3 = &this->globalInstantiations;
LAB_0035a9a3:
      do {
        ppVar51 = iVar123.p_;
        pRVar13 = (this->root)._M_t.
                  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                  .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        pSVar49 = &pRVar13->super_Scope;
        if (pRVar13 == (RootSymbol *)0x0) {
          pSVar49 = (Scope *)0x0;
        }
        if ((ppVar51->first).
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
            super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl == pSVar49) {
          ppSVar14 = (ppVar51->second).first.
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppSVar71 = (ppVar51->second).first.
                          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppSVar71 != ppSVar14;
              ppSVar71 = ppSVar71 + 1) {
            pSVar18 = *ppSVar71;
            if (pSVar18->kind == 2) {
              uVar42 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)pfVar3,&pSVar18->name);
              uVar41 = uVar42 >> ((byte)(pfVar3->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                        .arrays.groups_size_index & 0x3f);
              lVar68 = (uVar42 & 0xff) * 4;
              uVar85 = (&UNK_0050901c)[lVar68];
              uVar99 = (&UNK_0050901d)[lVar68];
              uVar100 = (&UNK_0050901e)[lVar68];
              bVar101 = (&UNK_0050901f)[lVar68];
              piVar66 = (identity *)0x0;
              uVar110 = uVar85;
              uVar111 = uVar99;
              uVar112 = uVar100;
              bVar108 = bVar101;
              uVar113 = uVar85;
              uVar114 = uVar99;
              uVar115 = uVar100;
              bVar116 = bVar101;
              uVar117 = uVar85;
              uVar118 = uVar99;
              uVar119 = uVar100;
              bVar120 = bVar101;
              do {
                pgVar15 = (this->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_;
                pgVar5 = pgVar15 + uVar41;
                local_78 = pgVar5->m[0].n;
                uStack_77 = pgVar5->m[1].n;
                uStack_76 = pgVar5->m[2].n;
                bStack_75 = pgVar5->m[3].n;
                uStack_74 = pgVar5->m[4].n;
                uStack_73 = pgVar5->m[5].n;
                uStack_72 = pgVar5->m[6].n;
                bStack_71 = pgVar5->m[7].n;
                uStack_70 = pgVar5->m[8].n;
                uStack_6f = pgVar5->m[9].n;
                uStack_6e = pgVar5->m[10].n;
                bStack_6d = pgVar5->m[0xb].n;
                uStack_6c = pgVar5->m[0xc].n;
                uStack_6b = pgVar5->m[0xd].n;
                uStack_6a = pgVar5->m[0xe].n;
                bVar36 = pgVar5->m[0xf].n;
                auVar90[0] = -(local_78 == uVar85);
                auVar90[1] = -(uStack_77 == uVar99);
                auVar90[2] = -(uStack_76 == uVar100);
                auVar90[3] = -(bStack_75 == bVar101);
                auVar90[4] = -(uStack_74 == uVar110);
                auVar90[5] = -(uStack_73 == uVar111);
                auVar90[6] = -(uStack_72 == uVar112);
                auVar90[7] = -(bStack_71 == bVar108);
                auVar90[8] = -(uStack_70 == uVar113);
                auVar90[9] = -(uStack_6f == uVar114);
                auVar90[10] = -(uStack_6e == uVar115);
                auVar90[0xb] = -(bStack_6d == bVar116);
                auVar90[0xc] = -(uStack_6c == uVar117);
                auVar90[0xd] = -(uStack_6b == uVar118);
                auVar90[0xe] = -(uStack_6a == uVar119);
                auVar90[0xf] = -(bVar36 == bVar120);
                uVar56 = (uint)(ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar90 >> 0x77,0) & 1) << 0xe);
                bStack_69 = bVar36;
                if (uVar56 != 0) {
                  local_298[1] = uVar99;
                  local_298[0] = uVar85;
                  local_298[2] = uVar100;
                  local_298[3] = bVar101;
                  local_298[4] = uVar110;
                  local_298[5] = uVar111;
                  local_298[6] = uVar112;
                  local_298[7] = bVar108;
                  local_298[8] = uVar113;
                  local_298[9] = uVar114;
                  local_298[10] = uVar115;
                  local_298[0xb] = bVar116;
                  local_298[0xc] = uVar117;
                  local_298[0xd] = uVar118;
                  local_298[0xe] = uVar119;
                  local_298[0xf] = bVar120;
                  local_2b8._0_8_ = pgVar15 + uVar41;
                  pbVar16 = (this->globalInstantiations).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.elements_;
                  in_R8 = piVar66;
                  do {
                    iVar37 = 0;
                    if (uVar56 != 0) {
                      for (; (uVar56 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
                      }
                    }
                    bVar84 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                             operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)pfVar3,&pSVar18->name,
                                        (basic_string_view<char,_std::char_traits<char>_> *)
                                        ((long)&pbVar16[uVar41 * 0xf]._M_len +
                                        (ulong)(uint)(iVar37 << 4)));
                    if (bVar84) goto LAB_0035aa15;
                    uVar56 = uVar56 - 1 & uVar56;
                  } while (uVar56 != 0);
                  bVar36 = *(byte *)(local_2b8._0_8_ + 0xf);
                  uVar85 = local_298[0];
                  uVar99 = local_298[1];
                  uVar100 = local_298[2];
                  bVar101 = local_298[3];
                  uVar110 = local_298[4];
                  uVar111 = local_298[5];
                  uVar112 = local_298[6];
                  bVar108 = local_298[7];
                  uVar113 = local_298[8];
                  uVar114 = local_298[9];
                  uVar115 = local_298[10];
                  bVar116 = local_298[0xb];
                  uVar117 = local_298[0xc];
                  uVar118 = local_298[0xd];
                  uVar119 = local_298[0xe];
                  bVar120 = local_298[0xf];
                }
                in_R8 = piVar66;
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar42 & 7] & bVar36) == 0)
                break;
                piVar63 = (identity *)
                          (this->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_size_mask;
                piVar64 = piVar66 + uVar41 + 1;
                piVar66 = piVar66 + 1;
                uVar41 = (ulong)piVar64 & (ulong)piVar63;
                in_R8 = piVar66;
              } while (piVar66 <= piVar63);
              if ((pSVar18[0xb].name._M_str[0x3c] == '\x01') &&
                 (pSVar18[0xb].parentScope == (Scope *)0x0)) {
                local_238.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                     (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
                     (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)pSVar18;
                std::
                vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                ::emplace_back<slang::ast::DefinitionSymbol_const*>
                          ((vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                            *)&this->unreferencedDefs,(DefinitionSymbol **)&local_238);
              }
            }
LAB_0035aa15:
          }
        }
        in_RCX = (Compilation *)(iVar123.pc_ + 0x12);
        pCVar38 = (Compilation *)(iVar123.pc_ + 2);
LAB_0035a9ca:
        pCVar40 = pCVar38;
        puVar58 = iVar123.pc_;
        ppVar76 = iVar123.p_ + 1;
        if (((uint)iVar123.pc_ & 0xf) != 0xe) goto code_r0x0035a9dc;
        auVar91[0] = -(*(char *)&(pCVar40->super_BumpAllocator).head == '\0');
        auVar91[1] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 1) == '\0');
        auVar91[2] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 2) == '\0');
        auVar91[3] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 3) == '\0');
        auVar91[4] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 4) == '\0');
        auVar91[5] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 5) == '\0');
        auVar91[6] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 6) == '\0');
        auVar91[7] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 7) == '\0');
        auVar91[8] = -(*(char *)&(pCVar40->super_BumpAllocator).endPtr == '\0');
        auVar91[9] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 1) == '\0');
        auVar91[10] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 2) == '\0');
        auVar91[0xb] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 3) == '\0');
        auVar91[0xc] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 4) == '\0');
        auVar91[0xd] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 5) == '\0');
        auVar91[0xe] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 6) == '\0');
        auVar91[0xf] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 7) == '\0');
        uVar34 = (ushort)(SUB161(auVar91 >> 7,0) & 1) | (ushort)(SUB161(auVar91 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar91 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar91 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar91 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar91 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar91 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar91 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar91 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar91 >> 0x77,0) & 1) << 0xe;
        while (uVar56 = (uint)uVar34, uVar56 == 0x7fff) {
          ppVar76 = ppVar76 + 0xf;
          auVar92[0] = -(*(char *)&(in_RCX->super_BumpAllocator).head == '\0');
          auVar92[1] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 1) == '\0');
          auVar92[2] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 2) == '\0');
          auVar92[3] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 3) == '\0');
          auVar92[4] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 4) == '\0');
          auVar92[5] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 5) == '\0');
          auVar92[6] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 6) == '\0');
          auVar92[7] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).head + 7) == '\0');
          auVar92[8] = -(*(char *)&(in_RCX->super_BumpAllocator).endPtr == '\0');
          auVar92[9] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 1) == '\0');
          auVar92[10] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 2) == '\0');
          auVar92[0xb] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 3) == '\0');
          auVar92[0xc] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 4) == '\0');
          auVar92[0xd] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 5) == '\0');
          auVar92[0xe] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 6) == '\0');
          auVar92[0xf] = -(*(char *)((long)&(in_RCX->super_BumpAllocator).endPtr + 7) == '\0');
          pCVar40 = in_RCX;
          in_RCX = (Compilation *)&in_RCX->options;
          uVar34 = (ushort)(SUB161(auVar92 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar92 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar92 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar92 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar92 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar92 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar92 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar92 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar92 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar92 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar92 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar92 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar92 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar92 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar92 >> 0x77,0) & 1) << 0xe;
        }
        ppVar51 = (table_element_pointer)(ulong)uVar56;
        uVar29 = 0;
        if ((uVar56 ^ 0x7fff) != 0) {
          for (; ((uVar56 ^ 0x7fff) >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        in_RCX = (Compilation *)(ulong)uVar29;
        if (*(char *)((long)&(pCVar40->super_BumpAllocator).head +
                     (long)&(in_RCX->super_BumpAllocator).head) == '\x01') break;
        iVar123.p_ = ppVar76 + (long)in_RCX;
        iVar123.pc_ = (char_pointer)
                      ((long)&(pCVar40->super_BumpAllocator).head +
                      (long)&(in_RCX->super_BumpAllocator).head);
      } while( true );
    }
LAB_0035ac00:
    local_288._0_8_ = local_190;
    if ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)
        local_178._8_8_ !=
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)0x0) {
      in_RCX = (Compilation *)0xaaaaaaaaaaaaaaab;
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
      ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
                    *)local_288,
                   (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                    *)local_178._8_8_,((long)local_180 * 0x178 + 0x186U) / 0x18);
      ppVar51 = extraout_RDX;
    }
  }
LAB_0035ac4d:
  sVar17 = local_140.
           super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
           .len;
  ppVar75 = local_140.
            super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
            .data_;
  if (local_140.
      super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
      .len != 0) {
    lVar81 = local_140.
             super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
             .len * 0x28;
    ppVar77 = local_140.
              super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              .data_ + local_140.
                       super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                       .len;
    lVar68 = 0x3f;
    if (local_140.
        super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
        .len != 0) {
      for (; local_140.
             super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
             .len >> lVar68 == 0; lVar68 = lVar68 + -1) {
      }
    }
    __comp_05._M_comp.__proj = in_R8;
    __comp_05._M_comp.__comp = (less *)in_RCX;
    std::
    __introsort_loop<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
              (local_140.
               super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
               .data_,ppVar77,(ulong)(((uint)lVar68 ^ 0x3f) * 2) ^ 0x7e,__comp_05);
    if ((long)sVar17 < 0x11) {
      __comp_00._M_comp.__proj = (identity *)in_RCX;
      __comp_00._M_comp.__comp = extraout_RDX_00;
      std::
      __insertion_sort<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (ppVar75,ppVar77,__comp_00);
      ppVar51 = extraout_RDX_03;
    }
    else {
      ppVar77 = ppVar75 + 0x10;
      __comp._M_comp.__proj = (identity *)in_RCX;
      __comp._M_comp.__comp = extraout_RDX_00;
      ppVar59 = ppVar77;
      std::
      __insertion_sort<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (ppVar75,ppVar77,__comp);
      lVar81 = lVar81 + -0x280;
      ppVar51 = extraout_RDX_01;
      do {
        __comp_03._M_comp.__proj = (identity *)ppVar51;
        __comp_03._M_comp.__comp = (less *)ppVar59;
        std::
        __unguarded_linear_insert<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,__gnu_cxx::__ops::_Val_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (ppVar77,__comp_03);
        ppVar77 = ppVar77 + 1;
        lVar81 = lVar81 + -0x28;
        ppVar51 = extraout_RDX_02;
      } while (lVar81 != 0);
    }
  }
  __first._M_current =
       (this->unreferencedDefs).
       super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->unreferencedDefs).
       super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar41 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar68 = 0x3f;
    if (uVar41 != 0) {
      for (; uVar41 >> lVar68 == 0; lVar68 = lVar68 + -1) {
      }
    }
    __comp_06._M_comp.__proj = in_R8;
    __comp_06._M_comp.__comp = (less *)in_RCX;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
              (__first,__last,(ulong)(((uint)lVar68 ^ 0x3f) * 2) ^ 0x7e,__comp_06);
    if ((long)__last._M_current - (long)__first._M_current < 0x81) {
      __comp_02._M_comp.__proj = (identity *)in_RCX;
      __comp_02._M_comp.__comp = extraout_RDX_04;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (__first,__last,__comp_02);
      ppVar51 = extraout_RDX_07;
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_01._M_comp.__proj = (identity *)in_RCX;
      __comp_01._M_comp.__comp = extraout_RDX_04;
      _Var60._M_current = __last_00._M_current;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (__first,__last_00,__comp_01);
      ppVar51 = extraout_RDX_05;
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        __comp_04._M_comp.__proj = (identity *)ppVar51;
        __comp_04._M_comp.__comp = (less *)_Var60._M_current;
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (__last_00,__comp_04);
        ppVar51 = extraout_RDX_06;
      }
    }
  }
  if (local_268.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
      .size_ctrl.size != 0) {
    if (local_140.
        super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
        .len == 0) {
      local_1f8._0_8_ = &local_1e0;
      local_1f8._8_16_ = ZEXT816(5) << 0x40;
      bVar84 = true;
      goto LAB_0035bc3d;
    }
    ppVar77 = local_140.
              super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              .data_ + local_140.
                       super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                       .len;
    arrays_ = &(this->hierarchyOverrides).childNodes;
    ppVar75 = local_140.
              super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              .data_;
    do {
      pSVar18 = (ppVar75->first).definition;
      if (pSVar18[1].nextInScope != (Symbol *)0x0) {
        pSVar49 = pSVar18[1].parentScope;
        puVar82 = (undefined1 *)((long)pSVar18[1].nextInScope * 0x40 + (long)pSVar49);
LAB_0035ada6:
        if ((*(char *)&pSVar49[1].compilation == '\0') &&
           (*(char *)((long)&pSVar49[1].compilation + 3) == '\x01')) {
          uVar42 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_268,
                              (basic_string_view<char,_std::char_traits<char>_> *)&pSVar49->nameMap)
          ;
          ppVar51 = (table_element_pointer)
                    (uVar42 >>
                    ((byte)local_268.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                           .arrays.groups_size_index._0_1_ & 0x3f));
          uVar10 = (&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word)[uVar42 & 0xff];
          auVar103._4_4_ = uVar10;
          auVar103._0_4_ = uVar10;
          auVar103._8_4_ = uVar10;
          auVar103._12_4_ = uVar10;
          uVar41 = 0;
          do {
            ppVar35 = local_268.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                      .arrays.elements_;
            piVar66 = (identity *)
                      ((long)local_268.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                             .arrays.groups_ + (long)ppVar51 * 0x10);
            local_a8 = *(uchar *)piVar66;
            uStack_a7 = *(uchar *)(piVar66 + 1);
            uStack_a6 = *(uchar *)(piVar66 + 2);
            uStack_a5 = *(uchar *)(piVar66 + 3);
            uStack_a4 = *(uchar *)(piVar66 + 4);
            uStack_a3 = *(uchar *)(piVar66 + 5);
            uStack_a2 = *(uchar *)(piVar66 + 6);
            uStack_a1 = *(uchar *)(piVar66 + 7);
            uStack_a0 = *(uchar *)(piVar66 + 8);
            uStack_9f = *(uchar *)(piVar66 + 9);
            uStack_9e = *(uchar *)(piVar66 + 10);
            uStack_9d = *(uchar *)(piVar66 + 0xb);
            uStack_9c = *(uchar *)(piVar66 + 0xc);
            uStack_9b = *(uchar *)(piVar66 + 0xd);
            uStack_9a = *(uchar *)(piVar66 + 0xe);
            iVar62 = piVar66[0xf];
            auVar93[0] = -(local_a8 == auVar103[0]);
            auVar93[1] = -(uStack_a7 == auVar103[1]);
            auVar93[2] = -(uStack_a6 == auVar103[2]);
            auVar93[3] = -(uStack_a5 == auVar103[3]);
            auVar93[4] = -(uStack_a4 == auVar103[4]);
            auVar93[5] = -(uStack_a3 == auVar103[5]);
            auVar93[6] = -(uStack_a2 == auVar103[6]);
            auVar93[7] = -(uStack_a1 == auVar103[7]);
            auVar93[8] = -(uStack_a0 == auVar103[8]);
            auVar93[9] = -(uStack_9f == auVar103[9]);
            auVar93[10] = -(uStack_9e == auVar103[10]);
            auVar93[0xb] = -(uStack_9d == auVar103[0xb]);
            auVar93[0xc] = -(uStack_9c == auVar103[0xc]);
            auVar93[0xd] = -(uStack_9b == auVar103[0xd]);
            auVar93[0xe] = -(uStack_9a == auVar103[0xe]);
            auVar93[0xf] = -(iVar62 == auVar103[0xf]);
            uVar56 = (uint)(ushort)((ushort)(SUB161(auVar93 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar93 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar93 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar93 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar93 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar93 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar93 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar93 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar93 >> 0x77,0) & 1) << 0xe);
            iStack_99 = iVar62;
            if (uVar56 != 0) {
              local_2b8._0_8_ =
                   (identity *)
                   ((long)local_268.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                          .arrays.groups_ + (long)ppVar51 * 0x10);
              local_298 = auVar103;
              do {
                uVar29 = 0;
                if (uVar56 != 0) {
                  for (; (uVar56 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                bVar84 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&local_268,
                                    (basic_string_view<char,_std::char_traits<char>_> *)
                                    &pSVar49->nameMap,
                                    &ppVar35[(long)ppVar51 * 0xf + (ulong)uVar29].first);
                if (bVar84) {
                  local_2c8._M_len = (size_t)pSVar18->originatingSyntax;
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = local_2c8._M_len;
                  uVar72 = SUB168(auVar30 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                           SUB168(auVar30 * ZEXT816(0x9e3779b97f4a7c15),0);
                  uVar67 = uVar72 >> ((byte)(this->hierarchyOverrides).childNodes.table_.
                                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                            .arrays.groups_size_index & 0x3f);
                  uVar10 = (&boost::unordered::detail::foa::
                             group15<boost::unordered::detail::foa::plain_integral>::
                             match_word(unsigned_long)::word)[uVar72 & 0xff];
                  ppVar21 = (this->hierarchyOverrides).childNodes.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                            .arrays.elements_;
                  uVar41 = (this->hierarchyOverrides).childNodes.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                           .arrays.groups_size_mask;
                  uVar69 = 0;
                  uVar52 = uVar67;
                  goto LAB_0035af88;
                }
                uVar56 = uVar56 - 1 & uVar56;
              } while (uVar56 != 0);
              iVar62 = *(identity *)(local_2b8._0_8_ + 0xf);
              auVar103 = local_298;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar42 & 7] & (byte)iVar62) == 0)
            break;
            lVar68 = uVar41 + 1;
            uVar41 = uVar41 + 1;
            ppVar51 = (table_element_pointer)
                      ((ulong)((long)&(ppVar51->first).
                                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                                      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>.
                                      _M_head_impl + lVar68) &
                      local_268.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                      .arrays.groups_size_mask);
          } while (uVar41 <= local_268.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                             .arrays.groups_size_mask);
        }
        goto LAB_0035adb4;
      }
LAB_0035b243:
      ppVar75 = ppVar75 + 1;
    } while (ppVar75 != ppVar77);
  }
  local_1f8._0_8_ = &local_1e0;
  local_1f8._8_16_ = ZEXT816(5) << 0x40;
  if (local_140.
      super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
      .len == 0) {
    bVar84 = true;
  }
  else {
    ppVar77 = local_140.
              super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              .data_ + local_140.
                       super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                       .len;
    ppVar75 = local_140.
              super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              .data_;
    do {
      pDVar19 = (DefinitionSymbol *)(ppVar75->first).definition;
      pSVar20 = (pDVar19->super_Symbol).originatingSyntax;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = pSVar20;
      uVar52 = SUB168(auVar32 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar32 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar67 = uVar52 >> ((byte)(this->hierarchyOverrides).childNodes.table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                .arrays.groups_size_index & 0x3f);
      uVar10 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                 word)[uVar52 & 0xff];
      ppVar21 = (this->hierarchyOverrides).childNodes.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                .arrays.elements_;
      uVar41 = (this->hierarchyOverrides).childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .arrays.groups_size_mask;
      uVar72 = 0;
      do {
        pgVar6 = (this->hierarchyOverrides).childNodes.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 .arrays.groups_ + uVar67;
        local_d8 = pgVar6->m[0].n;
        uStack_d7 = pgVar6->m[1].n;
        uStack_d6 = pgVar6->m[2].n;
        bStack_d5 = pgVar6->m[3].n;
        uStack_d4 = pgVar6->m[4].n;
        uStack_d3 = pgVar6->m[5].n;
        uStack_d2 = pgVar6->m[6].n;
        bStack_d1 = pgVar6->m[7].n;
        uStack_d0 = pgVar6->m[8].n;
        uStack_cf = pgVar6->m[9].n;
        uStack_ce = pgVar6->m[10].n;
        bStack_cd = pgVar6->m[0xb].n;
        uStack_cc = pgVar6->m[0xc].n;
        uStack_cb = pgVar6->m[0xd].n;
        uStack_ca = pgVar6->m[0xe].n;
        bStack_c9 = pgVar6->m[0xf].n;
        uVar85 = (uchar)uVar10;
        auVar106[0] = -(local_d8 == uVar85);
        uVar99 = (uchar)((uint)uVar10 >> 8);
        auVar106[1] = -(uStack_d7 == uVar99);
        uVar100 = (uchar)((uint)uVar10 >> 0x10);
        auVar106[2] = -(uStack_d6 == uVar100);
        bVar101 = (byte)((uint)uVar10 >> 0x18);
        auVar106[3] = -(bStack_d5 == bVar101);
        auVar106[4] = -(uStack_d4 == uVar85);
        auVar106[5] = -(uStack_d3 == uVar99);
        auVar106[6] = -(uStack_d2 == uVar100);
        auVar106[7] = -(bStack_d1 == bVar101);
        auVar106[8] = -(uStack_d0 == uVar85);
        auVar106[9] = -(uStack_cf == uVar99);
        auVar106[10] = -(uStack_ce == uVar100);
        auVar106[0xb] = -(bStack_cd == bVar101);
        auVar106[0xc] = -(uStack_cc == uVar85);
        auVar106[0xd] = -(uStack_cb == uVar99);
        auVar106[0xe] = -(uStack_ca == uVar100);
        auVar106[0xf] = -(bStack_c9 == bVar101);
        for (uVar56 = (uint)(ushort)((ushort)(SUB161(auVar106 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar106 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar106 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar106 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar106 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar106 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar106 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar106 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar106 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar106 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar106 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar106 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar106 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar106 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar106 >> 0x77,0) & 1) << 0xe); uVar56 != 0;
            uVar56 = uVar56 - 1 & uVar56) {
          iVar37 = 0;
          if (uVar56 != 0) {
            for (; (uVar56 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
            }
          }
          if (*(SyntaxNode **)
               ((long)&ppVar21[uVar67 * 0xf].first.value + (ulong)(uint)(iVar37 << 7)) == pSVar20) {
            pHVar43 = (HierarchyOverrideNode *)
                      ((long)&ppVar21[uVar67 * 0xf].second.paramOverrides.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                              .arrays.groups_size_index + (ulong)(uint)(iVar37 << 7));
            goto LAB_0035b386;
          }
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar52 & 7] & bStack_c9) == 0)
        break;
        lVar68 = uVar67 + uVar72;
        uVar72 = uVar72 + 1;
        uVar67 = lVar68 + 1U & uVar41;
      } while (uVar72 <= uVar41);
      pHVar43 = (HierarchyOverrideNode *)0x0;
LAB_0035b386:
      pIVar44 = InstanceSymbol::createDefault
                          (this,pDVar19,pHVar43,(ppVar75->first).configRoot,
                           (ppVar75->first).configRule,(SourceLocation)0x0);
      pRVar13 = (this->root)._M_t.
                super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
      Scope::insertMember(&pRVar13->super_Scope,(Symbol *)pIVar44,(pRVar13->super_Scope).lastMember,
                          false,true);
      local_288._0_8_ = pIVar44;
      SmallVectorBase<slang::ast::InstanceSymbol_const*>::
      emplace_back<slang::ast::InstanceSymbol_const*>
                ((SmallVectorBase<slang::ast::InstanceSymbol_const*> *)local_1f8,
                 (InstanceSymbol **)local_288);
      ppVar75 = ppVar75 + 1;
    } while (ppVar75 != ppVar77);
    bVar84 = local_140.
             super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
             .len == 0;
    ppVar51 = extraout_RDX_09;
  }
LAB_0035bc3d:
  if ((((this->options).flags.m_bits & 0x50) == 0) && (bVar84)) {
    Scope::addDiag(&((this->root)._M_t.
                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                    super_Scope,(DiagCode)0x2a000d,(SourceLocation)0xffffffffffffffff);
    ppVar51 = extraout_RDX_10;
  }
  ppDVar26 = (this->unreferencedDefs).
             super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppDVar80 = (this->unreferencedDefs).
                  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppDVar80 != ppDVar26;
      ppDVar80 = ppDVar80 + 1) {
    pRVar13 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    pIVar44 = InstanceSymbol::createInvalid(this,*ppDVar80);
    Scope::insertMember(&pRVar13->super_Scope,(Symbol *)pIVar44,(pRVar13->super_Scope).lastMember,
                        false,true);
    ppVar51 = extraout_RDX_11;
  }
  iVar37 = SmallVectorBase<const_slang::ast::InstanceSymbol_*>::copy
                     ((SmallVectorBase<const_slang::ast::InstanceSymbol_*> *)local_1f8,
                      (EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)ppVar51);
  pRVar13 = (this->root)._M_t.
            super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
            .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  (pRVar13->topInstances)._M_ptr = (pointer)CONCAT44(extraout_var,iVar37);
  (pRVar13->topInstances)._M_extent._M_extent_value = extraout_RDX_12;
  ppCVar27 = (this->compilationUnits).
             super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar28 = (this->compilationUnits).
             super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pRVar13 = (this->root)._M_t.
            super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
            .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  (pRVar13->compilationUnits)._M_ptr = ppCVar27;
  (pRVar13->compilationUnits)._M_extent._M_extent_value = (long)ppCVar28 - (long)ppCVar27 >> 3;
  this->finalized = true;
  this->finalizing = false;
  pRVar13 = (this->root)._M_t.
            super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
            .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  if ((DefinitionSymbol *)local_1f8._0_8_ != (DefinitionSymbol *)&local_1e0) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (local_140.
      super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
      .data_ != (pointer)local_140.
                         super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                         .firstElement) {
    operator_delete(local_140.
                    super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                    .data_);
  }
  this->finalizing = false;
  if (local_268.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
      .arrays.elements_ != (value_type_pointer)0x0) {
    operator_delete(local_268.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                    .arrays.elements_,
                    ((local_268.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                      .arrays.groups_size_mask * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
  }
  return pRVar13;
joined_r0x0035b62d:
  if (ppSVar71 ==
      (__u->second).first.
      super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0035b666;
  pSVar18 = *ppSVar71;
  if ((pSVar18->kind == Definition) &&
     ((pSVar46 = (SourceLibrary *)pSVar18[0xb].name._M_str, pSVar46 == pSVar48 ||
      ((pSVar48 == (SourceLibrary *)0x0 && (pSVar46->isDefault != false)))))) {
    if ((pSVar18[1].name._M_len & 0xfffffffd) != 0) goto LAB_0035b956;
    if (pSVar18[1].nextInScope == (Symbol *)0x0) goto LAB_0035ba0e;
    pPVar57 = (ParameterDecl *)pSVar18[1].parentScope;
    pPVar39 = pPVar57 + (long)pSVar18[1].nextInScope;
    goto LAB_0035b7f3;
  }
  ppSVar71 = ppSVar71 + 1;
  goto joined_r0x0035b62d;
LAB_0035b7f3:
  bVar84 = DefinitionSymbol::ParameterDecl::hasDefault(pPVar57);
  if (bVar84) goto LAB_0035b7ff;
  if (pPVar57->isTypeParam == false) {
    uVar42 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        &local_268,&pPVar57->name);
    uVar41 = uVar42 >> ((byte)local_268.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                              .arrays.groups_size_index._0_1_ & 0x3f);
    uVar10 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match_word(unsigned_long)::word)[uVar42 & 0xff];
    auVar107._4_4_ = uVar10;
    auVar107._0_4_ = uVar10;
    auVar107._8_4_ = uVar10;
    auVar107._12_4_ = uVar10;
    piVar66 = (identity *)(ulong)((uint)uVar42 & 7);
    uVar52 = 0;
    do {
      ppVar35 = local_268.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                .arrays.elements_;
      in_R8 = (identity *)(uVar41 * 0x10);
      piVar63 = (identity *)
                ((long)local_268.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                       .arrays.groups_ + (long)in_R8);
      local_58 = *(uchar *)piVar63;
      uStack_57 = *(uchar *)(piVar63 + 1);
      uStack_56 = *(uchar *)(piVar63 + 2);
      uStack_55 = *(uchar *)(piVar63 + 3);
      uStack_54 = *(uchar *)(piVar63 + 4);
      uStack_53 = *(uchar *)(piVar63 + 5);
      uStack_52 = *(uchar *)(piVar63 + 6);
      uStack_51 = *(uchar *)(piVar63 + 7);
      uStack_50 = *(uchar *)(piVar63 + 8);
      uStack_4f = *(uchar *)(piVar63 + 9);
      uStack_4e = *(uchar *)(piVar63 + 10);
      uStack_4d = *(uchar *)(piVar63 + 0xb);
      uStack_4c = *(uchar *)(piVar63 + 0xc);
      uStack_4b = *(uchar *)(piVar63 + 0xd);
      uStack_4a = *(uchar *)(piVar63 + 0xe);
      iVar62 = piVar63[0xf];
      auVar96[0] = -(local_58 == auVar107[0]);
      auVar96[1] = -(uStack_57 == auVar107[1]);
      auVar96[2] = -(uStack_56 == auVar107[2]);
      auVar96[3] = -(uStack_55 == auVar107[3]);
      auVar96[4] = -(uStack_54 == auVar107[4]);
      auVar96[5] = -(uStack_53 == auVar107[5]);
      auVar96[6] = -(uStack_52 == auVar107[6]);
      auVar96[7] = -(uStack_51 == auVar107[7]);
      auVar96[8] = -(uStack_50 == auVar107[8]);
      auVar96[9] = -(uStack_4f == auVar107[9]);
      auVar96[10] = -(uStack_4e == auVar107[10]);
      auVar96[0xb] = -(uStack_4d == auVar107[0xb]);
      auVar96[0xc] = -(uStack_4c == auVar107[0xc]);
      auVar96[0xd] = -(uStack_4b == auVar107[0xd]);
      auVar96[0xe] = -(uStack_4a == auVar107[0xe]);
      auVar96[0xf] = -(iVar62 == auVar107[0xf]);
      uVar56 = (uint)(ushort)((ushort)(SUB161(auVar96 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar96 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar96 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar96 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar96 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar96 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar96 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar96 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar96 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar96 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar96 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar96 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar96 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar96 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar96 >> 0x77,0) & 1) << 0xe);
      iStack_49 = iVar62;
      if (uVar56 != 0) {
        piVar63 = (identity *)
                  ((long)local_268.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                         .arrays.groups_ + (long)in_R8);
        local_2b8 = auVar107;
        local_2a0 = piVar66;
        do {
          uVar29 = 0;
          if (uVar56 != 0) {
            for (; (uVar56 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          bVar84 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              &local_268,&pPVar57->name,&ppVar35[uVar41 * 0xf + (ulong)uVar29].first
                             );
          if (bVar84) goto LAB_0035b7ff;
          uVar56 = uVar56 - 1 & uVar56;
        } while (uVar56 != 0);
        iVar62 = piVar63[0xf];
        piVar66 = local_2a0;
        auVar107 = local_2b8;
      }
      if (((byte)piVar66[0x509410] & (byte)iVar62) == 0) break;
      lVar68 = uVar41 + uVar52;
      uVar52 = uVar52 + 1;
      uVar41 = lVar68 + 1U &
               local_268.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
               .arrays.groups_size_mask;
    } while (uVar52 <= local_268.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                       .arrays.groups_size_mask);
  }
LAB_0035b956:
  pDVar47 = Scope::addDiag(pSVar18->parentScope,(DiagCode)0x10000d,
                           (SourceLocation)0xffffffffffffffff);
  arg._M_str = (char *)local_298._0_8_;
  arg._M_len = (size_t)pSVar20;
  Diagnostic::operator<<(pDVar47,arg);
  goto LAB_0035bb76;
LAB_0035b7ff:
  pPVar57 = pPVar57 + 1;
  if (pPVar57 == pPVar39) goto LAB_0035ba0e;
  goto LAB_0035b7f3;
LAB_0035ba0e:
  auStack_150 = (undefined1  [16])0x0;
  local_158 = pSVar18;
  getRoot::anon_class_24_3_d9e6786c::operator()
            ((anon_class_24_3_d9e6786c *)local_288,(DefinitionLookupResult)ZEXT824(pSVar18),
             (SourceRange)ZEXT816(0));
LAB_0035bb76:
  local_310 = iVar122.pc_;
  in_RCX = (Compilation *)(local_310 + 0x12);
  pCVar38 = (Compilation *)(local_310 + 2);
LAB_0035bb8b:
  pCVar40 = pCVar38;
  puVar65 = iVar122.pc_;
  pbVar79 = iVar122.p_ + 1;
  if (((uint)iVar122.pc_ & 0xf) != 0xe) goto code_r0x0035bb99;
  auVar97[0] = -(*(char *)&(pCVar40->super_BumpAllocator).head == '\0');
  auVar97[1] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 1) == '\0');
  auVar97[2] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 2) == '\0');
  auVar97[3] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 3) == '\0');
  auVar97[4] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 4) == '\0');
  auVar97[5] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 5) == '\0');
  auVar97[6] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 6) == '\0');
  auVar97[7] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).head + 7) == '\0');
  auVar97[8] = -(*(char *)&(pCVar40->super_BumpAllocator).endPtr == '\0');
  auVar97[9] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 1) == '\0');
  auVar97[10] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 2) == '\0');
  auVar97[0xb] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 3) == '\0');
  auVar97[0xc] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 4) == '\0');
  auVar97[0xd] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 5) == '\0');
  auVar97[0xe] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 6) == '\0');
  auVar97[0xf] = -(*(char *)((long)&(pCVar40->super_BumpAllocator).endPtr + 7) == '\0');
  uVar34 = (ushort)(SUB161(auVar97 >> 7,0) & 1) | (ushort)(SUB161(auVar97 >> 0xf,0) & 1) << 1 |
           (ushort)(SUB161(auVar97 >> 0x17,0) & 1) << 2 |
           (ushort)(SUB161(auVar97 >> 0x1f,0) & 1) << 3 |
           (ushort)(SUB161(auVar97 >> 0x27,0) & 1) << 4 |
           (ushort)(SUB161(auVar97 >> 0x2f,0) & 1) << 5 |
           (ushort)(SUB161(auVar97 >> 0x37,0) & 1) << 6 |
           (ushort)(SUB161(auVar97 >> 0x3f,0) & 1) << 7 |
           (ushort)(SUB161(auVar97 >> 0x47,0) & 1) << 8 |
           (ushort)(SUB161(auVar97 >> 0x4f,0) & 1) << 9 |
           (ushort)(SUB161(auVar97 >> 0x57,0) & 1) << 10 |
           (ushort)(SUB161(auVar97 >> 0x5f,0) & 1) << 0xb |
           (ushort)(SUB161(auVar97 >> 0x67,0) & 1) << 0xc |
           (ushort)(SUB161(auVar97 >> 0x6f,0) & 1) << 0xd |
           (ushort)(SUB161(auVar97 >> 0x77,0) & 1) << 0xe;
  while (pCVar38 = in_RCX, uVar34 == 0x7fff) {
    pbVar79 = pbVar79 + 0xf;
    auVar98[0] = -(*(char *)&(pCVar38->super_BumpAllocator).head == '\0');
    auVar98[1] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).head + 1) == '\0');
    auVar98[2] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).head + 2) == '\0');
    auVar98[3] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).head + 3) == '\0');
    auVar98[4] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).head + 4) == '\0');
    auVar98[5] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).head + 5) == '\0');
    auVar98[6] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).head + 6) == '\0');
    auVar98[7] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).head + 7) == '\0');
    auVar98[8] = -(*(char *)&(pCVar38->super_BumpAllocator).endPtr == '\0');
    auVar98[9] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).endPtr + 1) == '\0');
    auVar98[10] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).endPtr + 2) == '\0');
    auVar98[0xb] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).endPtr + 3) == '\0');
    auVar98[0xc] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).endPtr + 4) == '\0');
    auVar98[0xd] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).endPtr + 5) == '\0');
    auVar98[0xe] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).endPtr + 6) == '\0');
    auVar98[0xf] = -(*(char *)((long)&(pCVar38->super_BumpAllocator).endPtr + 7) == '\0');
    in_RCX = (Compilation *)&pCVar38->options;
    pCVar40 = pCVar38;
    uVar34 = (ushort)(SUB161(auVar98 >> 7,0) & 1) | (ushort)(SUB161(auVar98 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar98 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar98 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar98 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar98 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar98 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar98 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar98 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar98 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar98 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar98 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar98 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar98 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar98 >> 0x77,0) & 1) << 0xe;
  }
  uVar56 = 0;
  if ((uVar34 ^ 0x7fff) != 0) {
    for (; ((uVar34 ^ 0x7fff) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
    }
  }
  in_RCX = (Compilation *)(ulong)uVar56;
  if (*(char *)((long)&(pCVar40->super_BumpAllocator).head +
               (long)&(in_RCX->super_BumpAllocator).head) == '\x01') goto LAB_0035a96c;
  iVar122.p_ = (table_element_pointer)((long)&pbVar79->_M_len + (ulong)(uVar56 << 4));
  iVar122.pc_ = (char_pointer)
                ((long)&(pCVar40->super_BumpAllocator).head +
                (long)&(in_RCX->super_BumpAllocator).head);
  goto LAB_0035b41c;
joined_r0x0035b9a1:
  if (puVar73 == puVar24) goto LAB_0035b9d0;
  this_00 = (ConfigBlockSymbol *)*puVar73;
  pSVar46 = Symbol::getSourceLibrary((Symbol *)this_00);
  if ((pSVar46 == pSVar48) || ((pSVar48 == (SourceLibrary *)0x0 && (pSVar46->isDefault != false))))
  {
    this_00->isUsed = true;
    if (this_00->resolved == false) {
      ConfigBlockSymbol::resolve(this_00);
    }
    sVar25 = (this_00->topCells)._M_extent._M_extent_value;
    if (sVar25 != 0) {
      pTVar74 = (this_00->topCells)._M_ptr;
      pTVar83 = pTVar74 + sVar25;
      do {
        local_210 = pTVar74->definition;
        local_200 = pTVar74->rule;
        result.configRoot = this_00;
        result.definition = &local_210->super_Symbol;
        result.configRule = local_200;
        pCStack_208 = this_00;
        getRoot::anon_class_24_3_d9e6786c::operator()
                  ((anon_class_24_3_d9e6786c *)local_288,result,pTVar74->sourceRange);
        pTVar74 = pTVar74 + 1;
      } while (pTVar74 != pTVar83);
    }
    goto LAB_0035bb76;
  }
  puVar73 = puVar73 + 1;
  goto joined_r0x0035b9a1;
code_r0x0035bb99:
  cVar9 = *(char *)((long)&pCVar40[-1].defaultLibPtr + 7);
  iVar122.p_ = pbVar79;
  iVar122.pc_ = puVar65 + 1;
  in_RCX = (Compilation *)((long)&(in_RCX->super_BumpAllocator).head + 1);
  pCVar38 = (Compilation *)((long)&(pCVar40->super_BumpAllocator).head + 1);
  if (cVar9 != '\0') goto code_r0x0035bbac;
  goto LAB_0035bb8b;
code_r0x0035bbac:
  if (cVar9 == '\x01') goto LAB_0035a96c;
  iVar122.pc_ = (char_pointer)((long)&pCVar40[-1].defaultLibPtr + 7);
  goto LAB_0035b41c;
code_r0x0035a9dc:
  bVar101 = *(byte *)((long)&pCVar40[-1].defaultLibPtr + 7);
  ppVar51 = (table_element_pointer)(ulong)bVar101;
  iVar123.p_ = ppVar76;
  iVar123.pc_ = puVar58 + 1;
  in_RCX = (Compilation *)((long)&(in_RCX->super_BumpAllocator).head + 1);
  pCVar38 = (Compilation *)((long)&(pCVar40->super_BumpAllocator).head + 1);
  if (bVar101 != 0) goto code_r0x0035a9ed;
  goto LAB_0035a9ca;
code_r0x0035a9ed:
  if (bVar101 == 1) goto LAB_0035ac00;
  iVar123.pc_ = (char_pointer)((long)&pCVar40[-1].defaultLibPtr + 7);
  goto LAB_0035a9a3;
code_r0x0035a4f4:
  bVar101 = *(byte *)((long)&pCVar40[-1].defaultLibPtr + 7);
  ppVar51 = (table_element_pointer)(ulong)bVar101;
  iVar121.p_ = ppVar76;
  iVar121.pc_ = puVar58 + 1;
  in_RCX = (Compilation *)((long)&(in_RCX->super_BumpAllocator).head + 1);
  pCVar38 = (Compilation *)((long)&(pCVar40->super_BumpAllocator).head + 1);
  if (bVar101 != 0) goto code_r0x0035a505;
  goto LAB_0035a4e1;
code_r0x0035a505:
  if (bVar101 == 1) goto LAB_0035ac4d;
  iVar121.pc_ = (char_pointer)((long)&pCVar40[-1].defaultLibPtr + 7);
  goto LAB_0035a4ba;
  while( true ) {
    lVar68 = uVar52 + uVar69;
    uVar69 = uVar69 + 1;
    uVar52 = lVar68 + 1U & uVar41;
    if (uVar41 < uVar69) break;
LAB_0035af88:
    pgVar6 = (this->hierarchyOverrides).childNodes.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
             .arrays.groups_ + uVar52;
    local_b8 = pgVar6->m[0].n;
    uStack_b7 = pgVar6->m[1].n;
    uStack_b6 = pgVar6->m[2].n;
    bStack_b5 = pgVar6->m[3].n;
    uStack_b4 = pgVar6->m[4].n;
    uStack_b3 = pgVar6->m[5].n;
    uStack_b2 = pgVar6->m[6].n;
    bStack_b1 = pgVar6->m[7].n;
    uStack_b0 = pgVar6->m[8].n;
    uStack_af = pgVar6->m[9].n;
    uStack_ae = pgVar6->m[10].n;
    bStack_ad = pgVar6->m[0xb].n;
    uStack_ac = pgVar6->m[0xc].n;
    uStack_ab = pgVar6->m[0xd].n;
    uStack_aa = pgVar6->m[0xe].n;
    bStack_a9 = pgVar6->m[0xf].n;
    uVar85 = (uchar)uVar10;
    auVar104[0] = -(local_b8 == uVar85);
    uVar99 = (uchar)((uint)uVar10 >> 8);
    auVar104[1] = -(uStack_b7 == uVar99);
    uVar100 = (uchar)((uint)uVar10 >> 0x10);
    auVar104[2] = -(uStack_b6 == uVar100);
    bVar101 = (byte)((uint)uVar10 >> 0x18);
    auVar104[3] = -(bStack_b5 == bVar101);
    auVar104[4] = -(uStack_b4 == uVar85);
    auVar104[5] = -(uStack_b3 == uVar99);
    auVar104[6] = -(uStack_b2 == uVar100);
    auVar104[7] = -(bStack_b1 == bVar101);
    auVar104[8] = -(uStack_b0 == uVar85);
    auVar104[9] = -(uStack_af == uVar99);
    auVar104[10] = -(uStack_ae == uVar100);
    auVar104[0xb] = -(bStack_ad == bVar101);
    auVar104[0xc] = -(uStack_ac == uVar85);
    auVar104[0xd] = -(uStack_ab == uVar99);
    auVar104[0xe] = -(uStack_aa == uVar100);
    auVar104[0xf] = -(bStack_a9 == bVar101);
    for (uVar56 = (uint)(ushort)((ushort)(SUB161(auVar104 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar104 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar104 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar104 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar104 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar104 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar104 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar104 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar104 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar104 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar104 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar104 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar104 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar104 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar104 >> 0x77,0) & 1) << 0xe); uVar56 != 0;
        uVar56 = uVar56 - 1 & uVar56) {
      iVar37 = 0;
      if (uVar56 != 0) {
        for (; (uVar56 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
        }
      }
      if (*(SyntaxNode **)((long)&ppVar21[uVar52 * 0xf].first.value + (ulong)(uint)(iVar37 << 7)) ==
          (SyntaxNode *)local_2c8._M_len) {
        ppVar54 = (pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                   *)((long)&ppVar21[uVar52 * 0xf].first.value + (ulong)(uint)(iVar37 << 7));
        goto LAB_0035b070;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar72 & 7] & bStack_a9) == 0) break;
  }
  if ((this->hierarchyOverrides).childNodes.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
      .size_ctrl.size <
      (this->hierarchyOverrides).childNodes.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
              ((locator *)local_1f8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                *)arrays_,(arrays_type *)arrays_,uVar67,uVar72,(try_emplace_args_t *)local_288,
               (Entry *)&local_2c8);
    psVar4 = &(this->hierarchyOverrides).childNodes.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
              .size_ctrl.size;
    *psVar4 = *psVar4 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
              ((locator *)local_1f8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                *)arrays_,uVar72,(try_emplace_args_t *)local_288,(Entry *)&local_2c8);
  }
  ppVar54 = (pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode> *)
            local_1f8._16_8_;
LAB_0035b070:
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)local_1f8,
                    (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)ppVar35[(long)ppVar51 * 0xf + (ulong)uVar29].second);
  pHVar43 = &ppVar54->second;
  local_1d0 = (Symbol *)0x0;
  local_238.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)pSVar49->thisSym;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_238.
       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
       .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
       super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
  uVar67 = SUB168(auVar31 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar31 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar52 = uVar67 >> ((byte)(ppVar54->second).paramOverrides.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar10 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word)[uVar67 & 0xff];
  uVar72 = 0;
  uVar41 = uVar52;
  do {
    pgVar7 = (ppVar54->second).paramOverrides.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
             .arrays.groups_ + uVar41;
    local_c8 = pgVar7->m[0].n;
    uStack_c7 = pgVar7->m[1].n;
    uStack_c6 = pgVar7->m[2].n;
    bStack_c5 = pgVar7->m[3].n;
    uStack_c4 = pgVar7->m[4].n;
    uStack_c3 = pgVar7->m[5].n;
    uStack_c2 = pgVar7->m[6].n;
    bStack_c1 = pgVar7->m[7].n;
    uStack_c0 = pgVar7->m[8].n;
    uStack_bf = pgVar7->m[9].n;
    uStack_be = pgVar7->m[10].n;
    bStack_bd = pgVar7->m[0xb].n;
    uStack_bc = pgVar7->m[0xc].n;
    uStack_bb = pgVar7->m[0xd].n;
    uStack_ba = pgVar7->m[0xe].n;
    bStack_b9 = pgVar7->m[0xf].n;
    uVar85 = (uchar)uVar10;
    auVar105[0] = -(local_c8 == uVar85);
    uVar99 = (uchar)((uint)uVar10 >> 8);
    auVar105[1] = -(uStack_c7 == uVar99);
    uVar100 = (uchar)((uint)uVar10 >> 0x10);
    auVar105[2] = -(uStack_c6 == uVar100);
    bVar101 = (byte)((uint)uVar10 >> 0x18);
    auVar105[3] = -(bStack_c5 == bVar101);
    auVar105[4] = -(uStack_c4 == uVar85);
    auVar105[5] = -(uStack_c3 == uVar99);
    auVar105[6] = -(uStack_c2 == uVar100);
    auVar105[7] = -(bStack_c1 == bVar101);
    auVar105[8] = -(uStack_c0 == uVar85);
    auVar105[9] = -(uStack_bf == uVar99);
    auVar105[10] = -(uStack_be == uVar100);
    auVar105[0xb] = -(bStack_bd == bVar101);
    auVar105[0xc] = -(uStack_bc == uVar85);
    auVar105[0xd] = -(uStack_bb == uVar99);
    auVar105[0xe] = -(uStack_ba == uVar100);
    auVar105[0xf] = -(bStack_b9 == bVar101);
    uVar56 = (uint)(ushort)((ushort)(SUB161(auVar105 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar105 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar105 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar105 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar105 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar105 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar105 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar105 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar105 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar105 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar105 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar105 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar105 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar105 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar105 >> 0x77,0) & 1) << 0xe);
    if (uVar56 != 0) {
      do {
        uVar29 = 0;
        if (uVar56 != 0) {
          for (; (uVar56 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        if (local_238.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
            super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl ==
            (Scope *)(ppVar54->second).paramOverrides.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                     .arrays.elements_[uVar41 * 0xf + (ulong)uVar29].first) goto LAB_0035b1d8;
        uVar56 = uVar56 - 1 & uVar56;
      } while (uVar56 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar67 & 7] & bStack_b9) == 0) break;
    uVar69 = (ppVar54->second).paramOverrides.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
             .arrays.groups_size_mask;
    lVar68 = uVar41 + uVar72;
    uVar72 = uVar72 + 1;
    uVar41 = lVar68 + 1U & uVar69;
  } while (uVar72 <= uVar69);
  if ((ppVar54->second).paramOverrides.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
      .size_ctrl.size <
      (ppVar54->second).paramOverrides.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,decltype(nullptr)>>
              ((locator *)local_288,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                *)pHVar43,(arrays_type *)pHVar43,uVar52,uVar67,(try_emplace_args_t *)&local_270,
               (SyntaxNode **)&local_238,(pair<slang::ConstantValue,_std::nullptr_t> *)local_1f8);
    psVar4 = &(ppVar54->second).paramOverrides.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
              .size_ctrl.size;
    *psVar4 = *psVar4 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,decltype(nullptr)>>
              ((locator *)local_288,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                *)pHVar43,uVar67,(try_emplace_args_t *)&local_270,(SyntaxNode **)&local_238,
               (pair<slang::ConstantValue,_std::nullptr_t> *)local_1f8);
  }
LAB_0035b1d8:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)local_1f8);
  ppVar51 = extraout_RDX_08;
LAB_0035adb4:
  pSVar49 = (Scope *)&pSVar49[1].thisSym;
  if (pSVar49 == (Scope *)puVar82) goto LAB_0035b243;
  goto LAB_0035ada6;
}

Assistant:

const RootSymbol& Compilation::getRoot(bool skipDefParamsAndBinds) {
    if (finalized)
        return *root;

    SLANG_ASSERT(!isFrozen());

    // Resolve default lib list now that we have all syntax trees added.
    defaultLiblist.reserve(options.defaultLiblist.size());
    for (auto& libName : options.defaultLiblist) {
        if (auto lib = getSourceLibrary(libName))
            defaultLiblist.push_back(lib);
    }

    // If any top-level parameter overrides were provided, parse them now.
    flat_hash_map<std::string_view, const ConstantValue*> cliOverrides;
    parseParamOverrides(cliOverrides);

    // If there are defparams we need to fully resolve their values up front before
    // we start elaborating any instances.
    if (!skipDefParamsAndBinds) {
        for (auto& tree : syntaxTrees) {
            auto& meta = tree->getMetadata();
            if (meta.hasDefparams || meta.hasBindDirectives) {
                resolveDefParamsAndBinds();
                break;
            }
        }
    }

    SLANG_ASSERT(!finalizing);
    finalizing = true;
    auto guard = ScopeGuard([this] { finalizing = false; });

    auto isValidTop = [&](auto& definition) {
        // All parameters must have defaults.
        for (auto& param : definition.parameters) {
            if (!param.hasDefault() &&
                (param.isTypeParam || cliOverrides.find(param.name) == cliOverrides.end())) {
                return false;
            }
        }
        return true;
    };

    // Find top level modules (and programs) that form the root of the design.
    // Iterate the definitions map before instantiating any top level modules,
    // since that can cause changes to the definition map itself.
    SmallVector<std::pair<DefinitionLookupResult, SourceRange>> topDefs;
    if (options.topModules.empty()) {
        for (auto& [key, defList] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            for (auto defSym : defList.first) {
                // Ignore definitions that are not top level. Top level definitions are:
                // - Modules and programs
                // - Not nested
                // - Have no non-defaulted parameters
                // - Not instantiated anywhere
                // - Not in a library
                if (defSym->kind != SymbolKind::Definition)
                    continue;

                auto& def = defSym->as<DefinitionSymbol>();
                if (!def.sourceLibrary.isDefault ||
                    globalInstantiations.find(def.name) != globalInstantiations.end()) {
                    continue;
                }

                // Library definitions are never automatically instantiated in any capacity.
                if (!def.syntaxTree || !def.syntaxTree->isLibraryUnit) {
                    if (def.definitionKind == DefinitionKind::Module ||
                        def.definitionKind == DefinitionKind::Program) {
                        if (isValidTop(def)) {
                            // This definition can be automatically instantiated.
                            topDefs.push_back({{&def}, {}});
                            continue;
                        }
                    }
                }

                // Otherwise this definition is unreferenced and not automatically instantiated.
                unreferencedDefs.push_back(&def);
            }
        }
    }
    else {
        SmallMap<std::string_view, size_t, 4> topNameMap;
        auto tryAddTop = [&](DefinitionLookupResult result, SourceRange sourceRange) {
            // Make sure this definition's name doesn't collide with a top
            // module we already previously selected.
            auto def = result.definition;
            auto [it, inserted] = topNameMap.emplace(def->name, topDefs.size());
            if (inserted) {
                topDefs.push_back({result, sourceRange});
                SLANG_ASSERT(def->kind == SymbolKind::Definition);
                def->as<DefinitionSymbol>().noteInstantiated();
            }
            else {
                auto& diag = root->addDiag(diag::MultipleTopDupName, sourceRange.start()
                                                                         ? sourceRange
                                                                         : SourceRange::NoLocation);
                diag << def->name;

                auto& entry = topDefs[it->second];
                if (entry.first.configRoot)
                    diag.addNote(diag::NoteConfigRule, entry.second);
            }
        };

        // If the list of top modules has already been provided we just need to
        // find and instantiate them.
        for (auto userProvidedName : options.topModules) {
            // Find the target library, if there is one specified.
            auto searchName = userProvidedName;
            const SourceLibrary* targetLib = nullptr;
            if (auto idx = searchName.find('.'); idx != std::string_view::npos) {
                targetLib = getSourceLibrary(searchName.substr(0, idx));
                if (!targetLib) {
                    root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation)
                        << userProvidedName;
                    continue;
                }

                searchName = searchName.substr(idx + 1);
            }

            // A trailing ':config' is stripped -- it's there to allow the user
            // to disambiguate modules and config blocks.
            bool onlyConfig = false;
            constexpr std::string_view configSuffix = ":config";
            if (searchName.ends_with(configSuffix)) {
                onlyConfig = true;
                searchName = searchName.substr(0, searchName.length() - configSuffix.length());
            }

            if (!onlyConfig) {
                if (auto defIt = definitionMap.find(std::tuple{searchName, root.get()});
                    defIt != definitionMap.end()) {

                    const DefinitionSymbol* foundDef = nullptr;
                    for (auto defSym : defIt->second.first) {
                        if (defSym->kind != SymbolKind::Definition)
                            continue;

                        auto& def = defSym->as<DefinitionSymbol>();
                        if (&def.sourceLibrary == targetLib ||
                            (!targetLib && def.sourceLibrary.isDefault)) {
                            foundDef = &def;
                            break;
                        }
                    }

                    if (foundDef) {
                        if ((foundDef->definitionKind == DefinitionKind::Module ||
                             foundDef->definitionKind == DefinitionKind::Program) &&
                            isValidTop(*foundDef)) {

                            tryAddTop({foundDef}, {});
                        }
                        else {
                            // Otherwise, issue an error because the user asked us to instantiate
                            // this.
                            foundDef->getParentScope()->addDiag(diag::InvalidTopModule,
                                                                SourceLocation::NoLocation)
                                << userProvidedName;
                        }
                        continue;
                    }
                }
            }

            if (auto confIt = configBlocks.find(searchName); confIt != configBlocks.end()) {
                const ConfigBlockSymbol* foundConf = nullptr;
                for (auto conf : confIt->second) {
                    auto lib = conf->getSourceLibrary();
                    SLANG_ASSERT(lib);

                    if (lib == targetLib || (!targetLib && lib->isDefault)) {
                        foundConf = conf;
                        break;
                    }
                }

                if (foundConf) {
                    foundConf->isUsed = true;
                    for (auto& cell : foundConf->getTopCells())
                        tryAddTop({&cell.definition, foundConf, cell.rule}, cell.sourceRange);
                    continue;
                }
            }

            root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation) << userProvidedName;
        }

        // Go back through the definition map and find all definitions that are unused,
        // unreferenced in the design, and candidates for instantiating in unreferenced
        // form to get some error checking of their contents.
        for (auto& [key, defList] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            for (auto defSym : defList.first) {
                if (defSym->kind != SymbolKind::Definition)
                    continue;

                auto& def = defSym->as<DefinitionSymbol>();
                if (globalInstantiations.find(def.name) == globalInstantiations.end() &&
                    def.sourceLibrary.isDefault && def.getInstanceCount() == 0) {
                    unreferencedDefs.push_back(&def);
                }
            }
        }
    }

    // Sort the list of definitions so that we get deterministic ordering of instances;
    // the order is otherwise dependent on iterating over a hash table.
    std::ranges::sort(topDefs, [](auto a, auto b) {
        return a.first.definition->name < b.first.definition->name;
    });
    std::ranges::sort(unreferencedDefs, [](auto a, auto b) { return a->name < b->name; });

    // If we have any cli param overrides we should apply them to
    // each top-level instance.
    // TODO: generalize these to full hierarchical paths
    if (!cliOverrides.empty()) {
        for (auto [result, _] : topDefs) {
            auto& def = result.definition->as<DefinitionSymbol>();
            for (auto& param : def.parameters) {
                if (!param.isTypeParam && param.hasSyntax) {
                    auto it = cliOverrides.find(param.name);
                    if (it != cliOverrides.end()) {
                        hierarchyOverrides.childNodes[*def.getSyntax()].paramOverrides.emplace(
                            param.valueDecl, std::pair{*it->second, nullptr});
                    }
                }
            }
        }
    }

    SmallVector<const InstanceSymbol*> topList;
    for (auto [result, _] : topDefs) {
        auto& def = result.definition->as<DefinitionSymbol>();
        HierarchyOverrideNode* hierarchyOverrideNode = nullptr;
        if (auto sit = hierarchyOverrides.childNodes.find(*def.getSyntax());
            sit != hierarchyOverrides.childNodes.end()) {
            hierarchyOverrideNode = &sit->second;
        }

        auto& instance = InstanceSymbol::createDefault(*this, def, hierarchyOverrideNode,
                                                       result.configRoot, result.configRule);
        root->addMember(instance);
        topList.push_back(&instance);
    }

    if (!hasFlag(CompilationFlags::LintMode | CompilationFlags::AllowTopLevelIfacePorts) &&
        topDefs.empty()) {
        root->addDiag(diag::NoTopModules, SourceLocation::NoLocation);
    }

    // For unreferenced definitions, go through and instantiate them with all empty
    // parameter values so that we get at least some semantic checking of the contents.
    for (auto def : unreferencedDefs)
        root->addMember(InstanceSymbol::createInvalid(*this, *def));

    root->topInstances = topList.copy(*this);
    root->compilationUnits = compilationUnits;
    finalizing = false;
    finalized = true;

    return *root;
}